

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O3

void __thiscall
gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::freeAll
          (StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_> *this)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  if (this->dataptr != (FedInfo **)0x0) {
    iVar1 = this->dataSlotIndex;
    if (0 < (long)iVar1) {
      operator_delete(this->dataptr[iVar1],0x200);
      iVar1 = this->dataSlotIndex;
      if (0 < (long)iVar1) {
        uVar2 = (long)iVar1 + 1;
        do {
          operator_delete(this->dataptr[uVar2 - 2],0x200);
          uVar2 = uVar2 - 1;
        } while (1 < uVar2);
        iVar1 = this->dataSlotIndex;
      }
    }
    if (iVar1 == 0) {
      operator_delete(*this->dataptr,0x200);
    }
    if (0 < this->freeIndex) {
      lVar3 = 0;
      do {
        operator_delete(this->freeblocks[lVar3],0x200);
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->freeIndex);
    }
    if (this->freeblocks != (FedInfo **)0x0) {
      operator_delete__(this->freeblocks);
    }
    if (this->dataptr != (FedInfo **)0x0) {
      operator_delete__(this->dataptr);
      return;
    }
  }
  return;
}

Assistant:

void freeAll()
        {
            if (dataptr != nullptr) {
                Allocator a;
                for (int jj = bsize - 1; jj >= 0;
                     --jj) {  // call destructors on the last block
                    dataptr[dataSlotIndex][jj].~X();
                }
                if (dataSlotIndex > 0) {
                    a.deallocate(dataptr[dataSlotIndex], blockSize);
                }
                // go in reverse order
                for (int ii = dataSlotIndex - 1; ii >= 0; --ii) {
                    for (int jj = blockSize - 1; jj >= 0;
                         --jj) {  // call destructors on the middle blocks
                        dataptr[ii][jj].~X();
                    }
                    a.deallocate(dataptr[ii], blockSize);
                }
                if (dataSlotIndex == 0) {
                    a.deallocate(dataptr[0], blockSize);
                }

                for (int ii = 0; ii < freeIndex; ++ii) {
                    a.deallocate(freeblocks[ii], blockSize);
                }
                // delete can handle a nullptr
                delete[] freeblocks;
                delete[] dataptr;
            }
        }